

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Tree::lookup_result::resolved(lookup_result *this)

{
  csubstr cVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDI;
  csubstr p;
  size_t in_stack_ffffffffffffff40;
  basic_substring<const_char> *len_;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar4;
  basic_substring<const_char> *this_00;
  basic_substring<const_char> local_70;
  char *local_60;
  undefined4 local_58;
  ulong local_50;
  basic_substring<const_char> *local_48;
  char *local_40;
  size_t local_38;
  char *local_30;
  undefined4 local_28;
  basic_substring<const_char> *local_20;
  long local_18;
  char *local_10;
  ulong local_8;
  
  local_18 = in_RDI + 0x18;
  local_20 = *(basic_substring<const_char> **)(in_RDI + 0x10);
  if (*(basic_substring<const_char> **)(in_RDI + 0x20) < local_20 &&
      local_20 != (basic_substring<const_char> *)0xffffffffffffffff) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x154e;
    handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
  }
  this_00 = local_20;
  if (local_20 == (basic_substring<const_char> *)0xffffffffffffffff) {
    this_00 = *(basic_substring<const_char> **)(in_RDI + 0x20);
  }
  basic_substring<const_char>::basic_substring
            (this_00,(char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40);
  local_70.str = local_10;
  local_70.len = local_8;
  bVar2 = basic_substring<const_char>::ends_with(&local_70,'.');
  if (bVar2) {
    local_50 = local_70.len - 1;
    len_ = &local_70;
    uVar4 = local_50 <= local_70.len || local_50 == 0xffffffffffffffff;
    local_48 = len_;
    if (local_50 > local_70.len && local_50 != 0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_58 = 0x154e;
      handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
    }
    basic_substring<const_char>::basic_substring
              (this_00,(char *)CONCAT17(uVar4,in_stack_ffffffffffffff48),(size_t)len_);
    local_70.str = local_40;
    local_70.len = local_38;
  }
  cVar1.len = local_70.len;
  cVar1.str = local_70.str;
  return cVar1;
}

Assistant:

csubstr Tree::lookup_result::resolved() const
{
    csubstr p = path.first(path_pos);
    if(p.ends_with('.'))
        p = p.first(p.len-1);
    return p;
}